

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

uint32_t __thiscall
ddd::DaTrie<true,_false,_false>::xcheck_in_block_
          (DaTrie<true,_false,_false> *this,Edge *edge,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint32_t uVar1;
  pointer pBVar2;
  bool bVar3;
  uint base;
  uint32_t uVar4;
  
  pBVar2 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (edge->size_ <= (ulong)pBVar2[block_pos].num_emps) {
    uVar1 = pBVar2[block_pos].head;
    uVar4 = uVar1;
    do {
      base = edge->labels_[0] ^ uVar4;
      bVar3 = is_target_(this,base,edge);
      if (bVar3) {
        return base;
      }
      uVar4 = *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar4) & 0x7fffffff;
    } while (uVar4 != uVar1);
  }
  return 0xffffffff;
}

Assistant:

uint32_t xcheck_in_block_(const Edge& edge, uint32_t block_pos,
                            const std::vector<BlockLink>& blocks) const {
    assert(0 < edge.size());

    if (blocks[block_pos].num_emps < edge.size()) {
      return NOT_FOUND;
    }

    auto head = blocks[block_pos].head;
    auto node_pos = head;

    do {
      auto base = node_pos ^*edge.begin();
      if (is_target_(base, edge)) {
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head);

    return NOT_FOUND;
  }